

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdcolor.c
# Opt level: O1

void build_ycc_rgb_table(j_decompress_ptr cinfo)

{
  jpeg_color_deconverter *pjVar1;
  _func_void_j_decompress_ptr *p_Var2;
  _func_void_j_decompress_ptr *p_Var3;
  _func_void_j_decompress_ptr_JSAMPIMAGE_JDIMENSION_JSAMPARRAY_int *p_Var4;
  _func_void_j_decompress_ptr_JSAMPIMAGE_JDIMENSION_JSAMPARRAY_int *p_Var5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  
  pjVar1 = cinfo->cconvert;
  p_Var3 = (_func_void_j_decompress_ptr *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x400);
  pjVar1[1].start_pass = p_Var3;
  p_Var4 = (_func_void_j_decompress_ptr_JSAMPIMAGE_JDIMENSION_JSAMPARRAY_int *)
           (*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x400);
  pjVar1[1].color_convert = p_Var4;
  p_Var3 = (_func_void_j_decompress_ptr *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x800);
  pjVar1[2].start_pass = p_Var3;
  p_Var5 = (_func_void_j_decompress_ptr_JSAMPIMAGE_JDIMENSION_JSAMPARRAY_int *)
           (*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x800);
  pjVar1[2].color_convert = p_Var5;
  p_Var3 = pjVar1[1].start_pass;
  p_Var4 = pjVar1[1].color_convert;
  p_Var2 = pjVar1[2].start_pass;
  lVar6 = -0xb2f480;
  lVar7 = -0xe25100;
  lVar8 = 0x5b6900;
  lVar9 = 0x2c8d00;
  lVar10 = 0;
  do {
    *(int *)(p_Var3 + lVar10) = (int)((ulong)lVar6 >> 0x10);
    *(int *)(p_Var4 + lVar10) = (int)((ulong)lVar7 >> 0x10);
    *(long *)(p_Var2 + lVar10 * 2) = lVar8;
    *(long *)(p_Var5 + lVar10 * 2) = lVar9;
    lVar10 = lVar10 + 4;
    lVar6 = lVar6 + 0x166e9;
    lVar7 = lVar7 + 0x1c5a2;
    lVar8 = lVar8 + -0xb6d2;
    lVar9 = lVar9 + -0x581a;
  } while (lVar10 != 0x400);
  return;
}

Assistant:

LOCAL(void)
build_ycc_rgb_table (j_decompress_ptr cinfo)
{
  my_cconvert_ptr cconvert = (my_cconvert_ptr) cinfo->cconvert;
  int i;
  INT32 x;
  SHIFT_TEMPS

  cconvert->Cr_r_tab = (int *)
    (*cinfo->mem->alloc_small) ((j_common_ptr) cinfo, JPOOL_IMAGE,
				(MAXJSAMPLE+1) * SIZEOF(int));
  cconvert->Cb_b_tab = (int *)
    (*cinfo->mem->alloc_small) ((j_common_ptr) cinfo, JPOOL_IMAGE,
				(MAXJSAMPLE+1) * SIZEOF(int));
  cconvert->Cr_g_tab = (INT32 *)
    (*cinfo->mem->alloc_small) ((j_common_ptr) cinfo, JPOOL_IMAGE,
				(MAXJSAMPLE+1) * SIZEOF(INT32));
  cconvert->Cb_g_tab = (INT32 *)
    (*cinfo->mem->alloc_small) ((j_common_ptr) cinfo, JPOOL_IMAGE,
				(MAXJSAMPLE+1) * SIZEOF(INT32));

  for (i = 0, x = -CENTERJSAMPLE; i <= MAXJSAMPLE; i++, x++) {
    /* i is the actual input pixel value, in the range 0..MAXJSAMPLE */
    /* The Cb or Cr value we are thinking of is x = i - CENTERJSAMPLE */
    /* Cr=>R value is nearest int to 1.40200 * x */
    cconvert->Cr_r_tab[i] = (int)
		    RIGHT_SHIFT(FIX(1.40200) * x + ONE_HALF, SCALEBITS);
    /* Cb=>B value is nearest int to 1.77200 * x */
    cconvert->Cb_b_tab[i] = (int)
		    RIGHT_SHIFT(FIX(1.77200) * x + ONE_HALF, SCALEBITS);
    /* Cr=>G value is scaled-up -0.71414 * x */
    cconvert->Cr_g_tab[i] = (- FIX(0.71414)) * x;
    /* Cb=>G value is scaled-up -0.34414 * x */
    /* We also add in ONE_HALF so that need not do it in inner loop */
    cconvert->Cb_g_tab[i] = (- FIX(0.34414)) * x + ONE_HALF;
  }
}